

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_unix.c
# Opt level: O0

int funchook_page_alloc(funchook_t *funchook,funchook_page_t **page_out,uint8_t *func,
                       ip_displacement_t *disp)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  long in_RDX;
  long *in_RSI;
  funchook_t *in_RDI;
  char errbuf [128];
  int i;
  int rv;
  void *addrs [2];
  int loop_cnt;
  long lVar4;
  void **in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  funchook_t *in_stack_ffffffffffffff68;
  int local_50;
  long local_48 [3];
  int local_2c;
  
  local_2c = 0;
  while( true ) {
    if (2 < local_2c) {
      funchook_set_error_message(in_RDI,"Failed to allocate memory in unused regions");
      return 8;
    }
    iVar1 = get_free_address(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                             in_stack_ffffffffffffff58);
    if (iVar1 != 0) break;
    for (local_50 = 1; -1 < local_50; local_50 = local_50 + -1) {
      if (local_48[local_50] != 0) {
        pvVar2 = mmap((void *)local_48[local_50],0x1000,3,0x22,-1,0);
        *in_RSI = (long)pvVar2;
        if (((ulong)(in_RDX - *in_RSI) < 0x7fffefff) || ((ulong)(*in_RSI - in_RDX) < 0x7fffefff)) {
          funchook_log(in_RDI,"  allocate page %p (size=%lu)\n",*in_RSI,0x1000);
          return 0;
        }
        if (*in_RSI == -1) {
          lVar4 = local_48[local_50];
          __errno_location();
          pcVar3 = funchook_strerror((int)((ulong)lVar4 >> 0x20),(char *)in_RDI,0x102c5c);
          funchook_set_error_message(in_RDI,"mmap failed(addr=%p): %s",lVar4,pcVar3);
          return 8;
        }
        funchook_log(in_RDI,"  try to allocate %p but %p (size=%lu)\n",local_48[local_50],*in_RSI,
                     0x1000);
        munmap((void *)*in_RSI,0x1000);
      }
    }
    local_2c = local_2c + 1;
  }
  return iVar1;
}

Assistant:

int funchook_page_alloc(funchook_t *funchook, funchook_page_t **page_out, uint8_t *func, ip_displacement_t *disp)
{
#if defined(CPU_64BIT)
    int loop_cnt;

    /* Loop three times just to avoid rare cases such as
     * unused memory region is used between 'get_free_address()'
     * and 'mmap()'.
     */
    for (loop_cnt = 0; loop_cnt < 3; loop_cnt++) {
        void *addrs[2];
        int rv = get_free_address(funchook, func, addrs);
        int i;

        if (rv != 0) {
            return rv;
        }
        for (i = 1; i >= 0; i--) {
            /* Try to use addr[1] (unused memory region after `func`)
             * and then addr[0] (before `func`)
             */
            if (addrs[i] == NULL) {
                continue;
            }
            *page_out = mmap(addrs[i], page_size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
            if (SAFE_JUMP_DISTANCE(func, *page_out) ||
                    SAFE_JUMP_DISTANCE(*page_out, func)) {
                funchook_log(funchook, "  allocate page %p (size=%"PRIuPTR")\n", *page_out, page_size);
                return 0;
            }
            if (*page_out == MAP_FAILED) {
                char errbuf[128];

                funchook_set_error_message(funchook, "mmap failed(addr=%p): %s", addrs[i],
                                           funchook_strerror(errno, errbuf, sizeof(errbuf)));
                return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
            }
            funchook_log(funchook, "  try to allocate %p but %p (size=%"PRIuPTR")\n", addrs[i], *page_out, page_size);
            munmap(*page_out, page_size);
        }
    }
    funchook_set_error_message(funchook, "Failed to allocate memory in unused regions");
    return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
#else
    char errbuf[128];

    *page_out = mmap(NULL, page_size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
    if (*page_out != MAP_FAILED) {
        funchook_log(funchook, "  allocate page %p (size=%"PRIuPTR")\n", *page_out, page_size);
        return 0;
    }
    funchook_set_error_message(funchook, "mmap failed: %s", funchook_strerror(errno, errbuf, sizeof(errbuf)));
    return FUNCHOOK_ERROR_MEMORY_ALLOCATION;
#endif
}